

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

shared_ptr<Liby::TcpServer> __thiscall
Liby::EventLoopGroup::creatTcpServer(EventLoopGroup *this,string *host,string *service)

{
  EventLoop **__args;
  TcpServer *this_00;
  _List_node_base *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Logger *this_01;
  string *in_RCX;
  int __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Socket **__p;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  shared_ptr<Liby::TcpServer> sVar3;
  SockPtr sockPtr;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  undefined1 local_59;
  Socket *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  SockPtr local_48;
  _List_node_base local_38;
  
  Resolver::resolve((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_38,service,
                    in_RCX);
  if (local_38._M_next == &local_38) {
    this_01 = Logger::getLogger();
    Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    *(undefined8 *)this = 0;
    *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_58 = (Socket *)0x0;
    __p = &local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Socket,std::allocator<Liby::Socket>,Liby::Endpoint&>
              (&local_50,__p,(allocator<Liby::Socket> *)&local_59,(Endpoint *)(local_38._M_next + 1)
              );
    Socket::listen(local_58,(int)__p,__n);
    __args = (EventLoop **)host[3]._M_dataplus._M_p;
    *(undefined8 *)this = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::TcpServer,std::allocator<Liby::TcpServer>,Liby::EventLoop*&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->bf_,(TcpServer **)this,
               (allocator<Liby::TcpServer> *)&local_59,__args);
    this_00 = *(TcpServer **)this;
    local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50._M_pi;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
    }
    TcpServer::setServerSocket(this_00,&local_48);
    if (local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    TcpServer::start(*(TcpServer **)this);
    _Var2._M_pi = extraout_RDX_00;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  while (local_38._M_next != &local_38) {
    p_Var1 = (((_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)
              &(local_38._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_38._M_next);
    _Var2._M_pi = extraout_RDX_02;
    local_38._M_next = p_Var1;
  }
  sVar3.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpServer>)
         sVar3.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpServer>
EventLoopGroup::creatTcpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front());

    try {
        sockPtr->listen();
    } catch(const char *err) {
        fatal(err);
    }

    std::shared_ptr<TcpServer> tcpServer =
        std::make_shared<TcpServer>(ploops_[0]);
    tcpServer->setServerSocket(sockPtr);

    tcpServer->start();

    return tcpServer;
}